

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

size_t __thiscall
anon_unknown.dwarf_44276fd::filename_pos(anon_unknown_dwarf_44276fd *this,StringRef str,Style style)

{
  anon_unknown_dwarf_44276fd *paVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  StringRef Chars;
  undefined1 local_28 [8];
  StringRef str_local;
  
  str_local.Data = str.Data;
  iVar2 = (int)str.Length;
  if (str_local.Data != (char *)0x0) {
    if ((this + -1)[(long)str_local.Data] == (anon_unknown_dwarf_44276fd)0x2f) {
      return (size_t)(str_local.Data + -1);
    }
    if (iVar2 == 0 && (this + -1)[(long)str_local.Data] == (anon_unknown_dwarf_44276fd)0x5c) {
      return (size_t)(str_local.Data + -1);
    }
  }
  bVar5 = iVar2 == 0;
  pcVar4 = "/";
  if (bVar5) {
    pcVar4 = "\\/";
  }
  Chars.Length = (ulong)bVar5 + 1;
  Chars.Data = pcVar4;
  local_28 = (undefined1  [8])this;
  pcVar4 = (char *)llvm::StringRef::find_last_of
                             ((StringRef *)local_28,Chars,(size_t)(str_local.Data + -1));
  if (pcVar4 == (char *)0xffffffffffffffff && bVar5) {
    pcVar3 = str_local.Data + -2;
    if (str_local.Data < str_local.Data + -2) {
      pcVar3 = str_local.Data;
    }
    do {
      pcVar4 = pcVar3 + -1;
      if (pcVar3 == (char *)0x0) {
        pcVar4 = (char *)0xffffffffffffffff;
        break;
      }
      paVar1 = (anon_unknown_dwarf_44276fd *)((long)local_28 + -1) + (long)pcVar3;
      pcVar3 = pcVar4;
    } while (*paVar1 != (anon_unknown_dwarf_44276fd)0x3a);
  }
  if (pcVar4 == (char *)0xffffffffffffffff) {
    pcVar4 = (char *)0x0;
  }
  else {
    if (pcVar4 == (char *)0x1) {
      if (str_local.Data == (char *)0x0) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                      ,0xf9,"char llvm::StringRef::operator[](size_t) const");
      }
      if (*(anon_unknown_dwarf_44276fd *)local_28 == (anon_unknown_dwarf_44276fd)0x2f) {
        return 0;
      }
      if (iVar2 == 0 && *(anon_unknown_dwarf_44276fd *)local_28 == (anon_unknown_dwarf_44276fd)0x5c)
      {
        return 0;
      }
    }
    pcVar4 = pcVar4 + 1;
  }
  return (size_t)pcVar4;
}

Assistant:

size_t filename_pos(StringRef str, Style style) {
    if (str.size() > 0 && is_separator(str[str.size() - 1], style))
      return str.size() - 1;

    size_t pos = str.find_last_of(separators(style), str.size() - 1);

    if (real_style(style) == Style::windows) {
      if (pos == StringRef::npos)
        pos = str.find_last_of(':', str.size() - 2);
    }

    if (pos == StringRef::npos || (pos == 1 && is_separator(str[0], style)))
      return 0;

    return pos + 1;
  }